

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

string * __thiscall
trompeloeil::params_string<trompeloeil::wildcard,trompeloeil::wildcard>
          (string *__return_storage_ptr__,trompeloeil *this,
          tuple<trompeloeil::wildcard,_trompeloeil::wildcard> *t)

{
  ostringstream local_190 [8];
  ostringstream os;
  tuple<trompeloeil::wildcard,_trompeloeil::wildcard> *t_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  stream_params<trompeloeil::wildcard,trompeloeil::wildcard>
            ((ostream *)local_190,(tuple<trompeloeil::wildcard,_trompeloeil::wildcard> *)this);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string
  params_string(
    std::tuple<T...> const& t)
  {
    std::ostringstream os;
    stream_params(os, t);
    return os.str();
  }